

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O1

void Acec_MoveDuplicates(Vec_Wec_t *vLits,Vec_Wec_t *vClasses)

{
  long lVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  ulong uVar7;
  int Class;
  int iVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  
  uVar7 = (ulong)(uint)vLits->nSize;
  if (vLits->nSize < 1) {
    uVar11 = 0;
  }
  else {
    uVar9 = 0;
    uVar11 = 0;
    do {
      if (uVar9 == (int)uVar7 - 1) break;
      if ((long)vClasses->nSize <= (long)uVar9) {
LAB_0062b57f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar2 = vLits->pArray;
      pVVar3 = vClasses->pArray;
      if (pVVar2[uVar9].nSize != pVVar3[uVar9].nSize) {
        __assert_fail("Vec_IntSize(vLevel1) == Vec_IntSize(vLevel2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/acec/acecCore.c"
                      ,0x148,"void Acec_MoveDuplicates(Vec_Wec_t *, Vec_Wec_t *)");
      }
      if (0 < pVVar3[uVar9].nSize) {
        lVar1 = uVar9 + 1;
        uVar7 = 0;
        iVar8 = -1;
        do {
          iVar10 = (int)uVar7;
          if (iVar10 < 0) {
LAB_0062b5bd:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar4 = pVVar3[uVar9].pArray;
          Class = piVar4[uVar7];
          if (iVar8 == Class) {
            if (pVVar2[uVar9].nSize <= iVar10) goto LAB_0062b5bd;
            piVar5 = pVVar2[uVar9].pArray;
            iVar8 = piVar5[uVar7];
            iVar12 = pVVar2[uVar9].nSize + -1;
            pVVar2[uVar9].nSize = iVar12;
            if (iVar10 < iVar12) {
              uVar15 = uVar7;
              piVar6 = piVar5 + uVar7;
              do {
                *piVar6 = piVar6[1];
                uVar14 = (int)uVar15 + 1;
                uVar15 = (ulong)uVar14;
                piVar6 = piVar6 + 1;
              } while ((int)uVar14 < pVVar2[uVar9].nSize);
            }
            if (pVVar3[uVar9].nSize <= iVar10) {
LAB_0062b59e:
              __assert_fail("i >= 0 && i < Vec_IntSize(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x408,"void Vec_IntDrop(Vec_Int_t *, int)");
            }
            iVar12 = pVVar3[uVar9].nSize + -1;
            pVVar3[uVar9].nSize = iVar12;
            if (iVar10 < iVar12) {
              piVar6 = piVar4 + uVar7;
              do {
                *piVar6 = piVar6[1];
                uVar14 = (int)uVar7 + 1;
                uVar7 = (ulong)uVar14;
                piVar6 = piVar6 + 1;
              } while ((int)uVar14 < pVVar3[uVar9].nSize);
            }
            if ((iVar10 == 0) || (iVar12 = pVVar2[uVar9].nSize, iVar12 < iVar10)) goto LAB_0062b59e;
            uVar14 = iVar10 - 1;
            pVVar2[uVar9].nSize = iVar12 + -1;
            if (iVar10 < iVar12) {
              uVar13 = uVar14;
              piVar5 = piVar5 + uVar14;
              do {
                *piVar5 = piVar5[1];
                uVar13 = uVar13 + 1;
                piVar5 = piVar5 + 1;
              } while ((int)uVar13 < pVVar2[uVar9].nSize);
            }
            iVar12 = pVVar3[uVar9].nSize;
            if (iVar12 < iVar10) goto LAB_0062b59e;
            pVVar3[uVar9].nSize = iVar12 + -1;
            if (iVar10 < iVar12) {
              piVar4 = piVar4 + uVar14;
              do {
                *piVar4 = piVar4[1];
                uVar14 = uVar14 + 1;
                piVar4 = piVar4 + 1;
              } while ((int)uVar14 < pVVar3[uVar9].nSize);
            }
            if ((vLits->nSize <= lVar1) || (vClasses->nSize <= lVar1)) goto LAB_0062b57f;
            Vec_IntInsertOrder(vLits->pArray + lVar1,vClasses->pArray + lVar1,iVar8,Class);
            if (pVVar2[uVar9].nSize != pVVar3[uVar9].nSize) {
              __assert_fail("Vec_IntSize(vLevel1) == Vec_IntSize(vLevel2)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/acec/acecCore.c"
                            ,0x15c,"void Acec_MoveDuplicates(Vec_Wec_t *, Vec_Wec_t *)");
            }
            if ((vLits->nSize <= lVar1) || (vClasses->nSize <= lVar1)) goto LAB_0062b57f;
            if (vLits->pArray[lVar1].nSize != vClasses->pArray[lVar1].nSize) {
              __assert_fail("Vec_IntSize(Vec_WecEntry(vLits, i+1)) == Vec_IntSize(Vec_WecEntry(vClasses, i+1))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/acec/acecCore.c"
                            ,0x15d,"void Acec_MoveDuplicates(Vec_Wec_t *, Vec_Wec_t *)");
            }
            iVar10 = iVar10 + -2;
            uVar11 = (ulong)((int)uVar11 + 1);
            Class = -1;
          }
          uVar7 = (ulong)(iVar10 + 1U);
          iVar8 = Class;
        } while ((int)(iVar10 + 1U) < pVVar3[uVar9].nSize);
      }
      uVar9 = uVar9 + 1;
      uVar7 = (ulong)vLits->nSize;
    } while ((long)uVar9 < (long)uVar7);
  }
  printf("Moved %d pairs of PPs to normalize the matrix.\n",uVar11);
  return;
}

Assistant:

void Acec_MoveDuplicates( Vec_Wec_t * vLits, Vec_Wec_t * vClasses )
{
    Vec_Int_t * vLevel1, * vLevel2; 
    int i, k, Prev, This, Entry, Counter = 0;
    Vec_WecForEachLevel( vLits, vLevel1, i )
    {
        if ( i == Vec_WecSize(vLits) - 1 )
            break;
        vLevel2 = Vec_WecEntry(vClasses, i);
        assert( Vec_IntSize(vLevel1) == Vec_IntSize(vLevel2) );
        Prev = -1;
        Vec_IntForEachEntry( vLevel2, This, k )
        {
            if ( Prev != This )
            {
                Prev = This;
                continue;
            }
            Prev = -1;
            Entry = Vec_IntEntry( vLevel1, k );

            Vec_IntDrop( vLevel1, k );
            Vec_IntDrop( vLevel2, k-- );

            Vec_IntDrop( vLevel1, k );
            Vec_IntDrop( vLevel2, k-- );

            Vec_IntInsertOrder( Vec_WecEntry(vLits, i+1), Vec_WecEntry(vClasses, i+1), Entry, This );

            assert( Vec_IntSize(vLevel1)                  == Vec_IntSize(vLevel2) );
            assert( Vec_IntSize(Vec_WecEntry(vLits, i+1)) == Vec_IntSize(Vec_WecEntry(vClasses, i+1)) );
            Counter++;
        }
    }
    printf( "Moved %d pairs of PPs to normalize the matrix.\n", Counter );
}